

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_icc.c
# Opt level: O3

int jas_icctagtabent_cmp(void *src,void *dst)

{
  int iVar1;
  
  iVar1 = 1;
  if (*(ulong *)((long)src + 8) <= *(ulong *)((long)dst + 8)) {
    iVar1 = -(uint)(*(ulong *)((long)src + 8) < *(ulong *)((long)dst + 8));
  }
  return iVar1;
}

Assistant:

static int jas_icctagtabent_cmp(const void *src, const void *dst)
{
	const jas_icctagtabent_t *srctagtabent = JAS_CAST(const jas_icctagtabent_t *, src);
	const jas_icctagtabent_t *dsttagtabent = JAS_CAST(const jas_icctagtabent_t *, dst);
	if (srctagtabent->off > dsttagtabent->off) {
		return 1;
	} else if (srctagtabent->off < dsttagtabent->off) {
		return -1;
	}
	return 0;
}